

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall GlobOpt::UpdateObjPtrValueType(GlobOpt *this,Opnd *opnd,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  TypeId TVar4;
  BOOL BVar5;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  StackSym *pSVar6;
  ValueInfo *pVVar7;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar8;
  Sym *pSVar9;
  undefined4 *puVar10;
  Value *this_02;
  EquivalentTypeSet *this_03;
  JITType *pJVar11;
  JITTypeHandler *pJVar12;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a0;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_9e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_9c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_9a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_98;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_96;
  TypeId local_94;
  ValueType newValueType;
  nullptr_t pvStack_90;
  TypeId typeId;
  uint16 local_7a;
  uint16 i;
  EquivalentTypeSet *typeSet;
  JITTypeHolderBase<void> local_68;
  JITTypeHolder type;
  JsTypeValueInfo *typeValueInfo;
  Value *typeValue;
  StackSym *typeSym;
  ValueInfo *objValueInfo;
  Value *pVStack_38;
  ValueType objValueType;
  Value *objVal;
  StackSym *objectSym;
  PropertySymOpnd *propertySymOpnd;
  Instr *instr_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  bVar2 = IR::Opnd::IsSymOpnd(opnd);
  if (!bVar2) {
    return;
  }
  this_00 = IR::Opnd::AsSymOpnd(opnd);
  bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar2) {
    return;
  }
  bVar2 = IR::Instr::HasTypeCheckBailOut(instr);
  if (!bVar2) {
    return;
  }
  if ((instr->m_opcode != CheckFixedFld) && (bVar2 = IsLoopPrePass(this), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x80e,
                       "(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass())",
                       "instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (instr->m_opcode != CheckFixedFld) {
    return;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(opnd);
  pSVar6 = IR::PropertySymOpnd::GetObjectSym(this_01);
  pVStack_38 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar6->super_Sym);
  if (pVStack_38 == (Value *)0x0) {
    return;
  }
  pVVar7 = ::Value::GetValueInfo(pVStack_38);
  paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
           ValueInfo::Type(pVVar7);
  objValueInfo._6_2_ = *paVar8;
  bVar2 = ValueType::IsDefinite((ValueType *)((long)&objValueInfo + 6));
  if (bVar2) {
    return;
  }
  pVVar7 = ::Value::GetValueInfo(pVStack_38);
  pSVar9 = ValueInfo::GetSymStore(pVVar7);
  if (pSVar9 != (Sym *)0x0) {
    pSVar9 = ValueInfo::GetSymStore(pVVar7);
    bVar2 = Sym::IsStackSym(pSVar9);
    if (bVar2) {
      pSVar9 = ValueInfo::GetSymStore(pVVar7);
      pSVar6 = Sym::AsStackSym(pSVar9);
      bVar2 = StackSym::IsFromByteCodeConstantTable(pSVar6);
      if (bVar2) {
        return;
      }
    }
  }
  bVar2 = IR::PropertySymOpnd::HasObjectTypeSym(this_01);
  if (bVar2) {
    pSVar6 = IR::PropertySymOpnd::GetObjectTypeSym(this_01);
    if (pSVar6 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x836,"(typeSym)","typeSym");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    this_02 = GlobOptBlockData::FindObjectTypeValue(&this->currentBlock->globOptData,pSVar6);
    if (this_02 == (Value *)0x0) {
      return;
    }
    pVVar7 = ::Value::GetValueInfo(this_02);
    type.t = (Type)ValueInfo::AsJsType(pVVar7);
    local_68.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)type.t);
    typeSet = (EquivalentTypeSet *)0x0;
    bVar2 = JITTypeHolderBase<void>::operator!=(&local_68,&typeSet);
    if (bVar2) {
      pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
      TVar4 = JITType::GetTypeId(pJVar11);
      bVar2 = Js::DynamicType::Is(TVar4);
      if (bVar2) {
        pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
        pJVar12 = JITType::GetTypeHandler(pJVar11);
        bVar2 = JITTypeHandler::IsLocked(pJVar12);
        if (!bVar2) {
          return;
        }
      }
    }
    else {
      this_03 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)type.t);
      if (this_03 == (EquivalentTypeSet *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x849,"(typeSet)","typeSet");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      for (local_7a = 0; uVar3 = Js::EquivalentTypeSet::GetCount(this_03), local_7a < uVar3;
          local_7a = local_7a + 1) {
        local_68.t = (Type)Js::EquivalentTypeSet::GetType(this_03,local_7a);
        pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
        TVar4 = JITType::GetTypeId(pJVar11);
        bVar2 = Js::DynamicType::Is(TVar4);
        if (bVar2) {
          pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
          pJVar12 = JITType::GetTypeHandler(pJVar11);
          bVar2 = JITTypeHandler::IsLocked(pJVar12);
          if (!bVar2) {
            return;
          }
        }
      }
    }
    pvStack_90 = (nullptr_t)0x0;
    bVar2 = JITTypeHolderBase<void>::operator!=(&local_68,&stack0xffffffffffffff70);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x855,"(type != nullptr)","type != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pJVar11 = JITTypeHolderBase<void>::operator->(&local_68);
    local_94 = JITType::GetTypeId(pJVar11);
    BVar5 = Js::TypedArrayBase::Is(local_94);
    if (BVar5 == 0) {
      local_96.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(local_94,false);
      local_98 = ValueType::Uninitialized.field_0;
      bVar2 = ValueType::operator==((ValueType *)&local_96.field_0,ValueType::Uninitialized);
      if (((bVar2) && (local_94 == TypeIds_Array)) && (bVar2 = DoArrayCheckHoist(this), bVar2)) {
        if (this->currentBlock->loop == (Loop *)0x0) {
          bVar2 = ImplicitCallFlagsAllowOpts(this->func);
        }
        else {
          bVar2 = ImplicitCallFlagsAllowOpts(this->currentBlock->loop);
        }
        if (bVar2) {
          bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)((long)&objValueInfo + 6));
          if (bVar2) {
            bVar2 = ValueType::HasNoMissingValues((ValueType *)((long)&objValueInfo + 6));
            if (!bVar2) {
              local_9c.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::GetObject(Array);
              local_9a.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetArrayTypeId((ValueType *)&local_9c.field_0,local_94);
              local_96.field_0 = local_9a.field_0;
            }
          }
          else {
            local_a0.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::GetObject(Array);
            local_9e.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetArrayTypeId((ValueType *)&local_a0.field_0,local_94);
            local_96.field_0 = local_9e.field_0;
          }
        }
      }
      bVar2 = ValueType::operator!=((ValueType *)&local_96.field_0,ValueType::Uninitialized);
      if (bVar2) {
        ChangeValueType(this,this->currentBlock,pVStack_38,(ValueType)local_96.field_0,false,true);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void
GlobOpt::UpdateObjPtrValueType(IR::Opnd * opnd, IR::Instr * instr)
{
    if (!opnd->IsSymOpnd() || !opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return;
    }

    if (!instr->HasTypeCheckBailOut())
    {
        // No type check bailout, we didn't check that type of the object pointer.
        return;
    }

    // Only check that fixed field should have type check bailout in loop prepass.
    Assert(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass());

    if (instr->m_opcode != Js::OpCode::CheckFixedFld)
    {
        // DeadStore pass may remove type check bailout, except CheckFixedFld which always needs
        // type check bailout. So we can only change the type for CheckFixedFld.
        // Consider: See if we can expand that in the future.
        return;
    }

    IR::PropertySymOpnd * propertySymOpnd = opnd->AsPropertySymOpnd();
    StackSym * objectSym = propertySymOpnd->GetObjectSym();
    Value * objVal = this->currentBlock->globOptData.FindValue(objectSym);
    if (!objVal)
    {
        return;
    }

    ValueType objValueType = objVal->GetValueInfo()->Type();
    if (objValueType.IsDefinite())
    {
        return;
    }

    ValueInfo *objValueInfo = objVal->GetValueInfo();

    // It is possible for a valueInfo to be not definite and still have a byteCodeConstant as symStore, this is because we conservatively copy valueInfo in prePass
    if (objValueInfo->GetSymStore() && objValueInfo->GetSymStore()->IsStackSym() && objValueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return;
    }

    // Verify that the types we're checking for here have been locked so that the type ID's can't be changed
    // without changing the type.
    if (!propertySymOpnd->HasObjectTypeSym())
    {
        return;
    }

    StackSym * typeSym = propertySymOpnd->GetObjectTypeSym();
    Assert(typeSym);
    Value * typeValue = currentBlock->globOptData.FindObjectTypeValue(typeSym);
    if (!typeValue)
    {
        return;
    }
    JsTypeValueInfo * typeValueInfo = typeValue->GetValueInfo()->AsJsType();
    JITTypeHolder type = typeValueInfo->GetJsType();
    if (type != nullptr)
    {
        if (Js::DynamicType::Is(type->GetTypeId()) &&
            !type->GetTypeHandler()->IsLocked())
        {
            return;
        }
    }
    else
    {
        Js::EquivalentTypeSet * typeSet = typeValueInfo->GetJsTypeSet();
        Assert(typeSet);
        for (uint16 i = 0; i < typeSet->GetCount(); i++)
        {
            type = typeSet->GetType(i);
            if (Js::DynamicType::Is(type->GetTypeId()) &&
                !type->GetTypeHandler()->IsLocked())
            {
                return;
            }
        }
    }

    AnalysisAssert(type != nullptr);
    Js::TypeId typeId = type->GetTypeId();

    if (Js::TypedArrayBase::Is(typeId))
    {
        // Type ID does not allow us to distinguish between virtual and non-virtual typed array.
        return;
    }

    // Passing false for useVirtual as we would never have a virtual typed array hitting this code path
    ValueType newValueType = ValueType::FromTypeId(typeId, false);

    if (newValueType == ValueType::Uninitialized)
    {
        switch (typeId)
        {
        default:
            // Can't mark as definite object because it may actually be object-with-array.
            // Consider: a value type that subsumes object, array, and object-with-array.
            break;
        case Js::TypeIds_NativeIntArray:
        case Js::TypeIds_NativeFloatArray:
            // Do not mark these values as definite to protect against array conversion
            break;
        case Js::TypeIds_Array:
            // Because array can change type id, we can only make it definite if we are doing array check hoist
            // so that implicit call will be installed between the array checks.
            if (!DoArrayCheckHoist() ||
                (currentBlock->loop
                ? !this->ImplicitCallFlagsAllowOpts(currentBlock->loop)
                : !this->ImplicitCallFlagsAllowOpts(this->func)))
            {
                break;
            }
            if (objValueType.IsLikelyArrayOrObjectWithArray())
            {
                // If we have likely no missing values before, keep the likely, because, we haven't proven that
                // the array really has no missing values
                if (!objValueType.HasNoMissingValues())
                {
                    newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
                }
            }
            else
            {
                newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
            }
            break;
        }
    }
    if (newValueType != ValueType::Uninitialized)
    {
        ChangeValueType(currentBlock, objVal, newValueType, false, true);
    }
}